

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XlearnCreateDataFromMat
              (real_t *data,index_t nrow,index_t ncol,real_t *label,index_t *field_map,
              DataHandle *out)

{
  real_t rVar1;
  ulong uVar2;
  DMatrix *this;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  float fVar9;
  
  uVar2 = (ulong)nrow;
  this = (DMatrix *)operator_new(0x68);
  this->pos = 0;
  this->row_length = 0;
  this->hash_value_1 = 0;
  this->hash_value_2 = 0;
  auVar8 = ZEXT464(0) << 0x40;
  this->row = (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               )auVar8._0_24_;
  this->Y = (vector<float,_std::allocator<float>_>)auVar8._24_24_;
  (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar8._48_8_;
  (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)auVar8._56_8_;
  *(undefined1 (*) [64])
   ((long)&(this->row).
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = auVar8;
  if (label == (real_t *)0x0) {
    this->has_label = false;
    if (field_map == (index_t *)0x0) {
      if (nrow != 0) {
        lVar5 = 0;
        uVar3 = 0;
        do {
          xLearn::DMatrix::AddRow(this);
          if (ncol == 0) {
            fVar9 = 0.0;
          }
          else {
            auVar7 = ZEXT816(0) << 0x40;
            uVar4 = 0;
            do {
              rVar1 = data[(int)lVar5 + (index_t)uVar4];
              xLearn::DMatrix::AddNode(this,(index_t)uVar3,(index_t)uVar4,rVar1,0);
              uVar4 = uVar4 + 1;
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416((uint)rVar1),
                                       ZEXT416(auVar7._0_4_));
              fVar9 = auVar7._0_4_;
            } while (ncol != uVar4);
          }
          lVar5 = lVar5 + (ulong)ncol;
          (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] = 1.0 / fVar9;
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar2);
      }
    }
    else if (nrow != 0) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        xLearn::DMatrix::AddRow(this);
        if (ncol == 0) {
          fVar9 = 0.0;
        }
        else {
          auVar7 = ZEXT816(0) << 0x40;
          uVar4 = 0;
          do {
            rVar1 = data[(int)lVar5 + (index_t)uVar4];
            xLearn::DMatrix::AddNode(this,(index_t)uVar3,(index_t)uVar4,rVar1,field_map[uVar4]);
            uVar4 = uVar4 + 1;
            auVar7 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416((uint)rVar1),ZEXT416(auVar7._0_4_)
                                    );
            fVar9 = auVar7._0_4_;
          } while (ncol != uVar4);
        }
        lVar5 = lVar5 + (ulong)ncol;
        (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = 1.0 / fVar9;
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
  }
  else {
    this->has_label = true;
    if (field_map == (index_t *)0x0) {
      if (nrow != 0) {
        lVar5 = 0;
        uVar3 = 0;
        do {
          xLearn::DMatrix::AddRow(this);
          (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] = label[uVar3];
          if (ncol == 0) {
            fVar9 = 0.0;
          }
          else {
            auVar7._0_12_ = ZEXT812(0);
            auVar7._12_4_ = 0;
            uVar4 = 0;
            do {
              rVar1 = data[(int)lVar5 + (index_t)uVar4];
              xLearn::DMatrix::AddNode(this,(index_t)uVar3,(index_t)uVar4,rVar1,0);
              uVar4 = uVar4 + 1;
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416((uint)rVar1),
                                       ZEXT416(auVar7._0_4_));
              fVar9 = auVar7._0_4_;
            } while (ncol != uVar4);
          }
          lVar5 = lVar5 + (ulong)ncol;
          (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] = 1.0 / fVar9;
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar2);
      }
    }
    else if (nrow != 0) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        xLearn::DMatrix::AddRow(this);
        (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar3] = label[uVar3];
        if (ncol == 0) {
          fVar9 = 0.0;
        }
        else {
          auVar6._0_12_ = ZEXT812(0);
          auVar6._12_4_ = 0;
          uVar4 = 0;
          do {
            rVar1 = data[(int)lVar5 + (index_t)uVar4];
            xLearn::DMatrix::AddNode(this,(index_t)uVar3,(index_t)uVar4,rVar1,field_map[uVar4]);
            uVar4 = uVar4 + 1;
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416((uint)rVar1),ZEXT416(auVar6._0_4_)
                                    );
            fVar9 = auVar6._0_4_;
          } while (ncol != uVar4);
        }
        lVar5 = lVar5 + (ulong)ncol;
        (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = 1.0 / fVar9;
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
  }
  *out = this;
  return 0;
}

Assistant:

XL_DLL int XlearnCreateDataFromMat(const real_t* data,
                                   index_t nrow,
                                   index_t ncol,
                                   const real_t* label,
                                   index_t* field_map,
                                   DataHandle* out) {
  API_BEGIN();
  std::unique_ptr<xLearn::DMatrix> source(new xLearn::DMatrix());	
  // if feature_map equal nullptr, we will not use field
  if (label == nullptr) {
    source->has_label = false;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  } else {
    source->has_label = true;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  }
  *out = source.release();
  API_END();
}